

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ExpressionListRef::Deserialize(ExpressionListRef *this,Deserializer *deserializer)

{
  ExpressionListRef *this_00;
  pointer pEVar1;
  _Head_base<0UL,_duckdb::ExpressionListRef_*,_false> local_20;
  
  this_00 = (ExpressionListRef *)operator_new(0xb0);
  ExpressionListRef(this_00);
  local_20._M_head_impl = this_00;
  pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"expected_names",&pEVar1->expected_names);
  pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xc9,"expected_types",&pEVar1->expected_types);
  pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,true>>
            (deserializer,0xca,"values",&pEVar1->values);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ExpressionListRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExpressionListRef>(new ExpressionListRef());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "expected_names", result->expected_names);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "expected_types", result->expected_types);
	deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<ParsedExpression>>>>(202, "values", result->values);
	return std::move(result);
}